

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O1

void Eigen::internal::LU_kernel_bmod<-1>::
     run<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int segsize,
               Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *tempv,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  double *pdVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  double *local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
  *local_c8;
  double *local_c0;
  long local_b8;
  long local_a8;
  double *local_a0;
  double *local_98;
  ulong local_90;
  double *local_88;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  
  iVar14 = lptr + no_zeros;
  lVar15 = (long)iVar14;
  if (0 < segsize) {
    pdVar2 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar11 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    lVar6 = *(long *)&dense->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    uVar10 = 0;
    if ((long)uVar11 < 1) {
      uVar11 = uVar10;
    }
    piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    do {
      if ((iVar14 < 0) ||
         ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(lVar15 + uVar10))) goto LAB_00157eb0;
      lVar13 = (long)piVar3[lVar15 + uVar10];
      if ((lVar13 < 0) ||
         (*(long *)&(dense->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8 <= lVar13)) goto LAB_00157e99;
      if (uVar11 == uVar10) goto LAB_00157ec7;
      pdVar2[uVar10] = *(double *)(lVar6 + lVar13 * 8);
      uVar10 = uVar10 + 1;
    } while ((uint)segsize != uVar10);
  }
  lVar6 = (long)((lda + 1) * no_zeros) + (long)*luptr;
  *luptr = (int)lVar6;
  if (lda < 0) {
LAB_00157f1c:
    __assert_fail("innerStride>=0 && outerStride>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                  ,0x40,
                  "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                 );
  }
  pdVar2 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (-1 < segsize || pdVar2 == (double *)0x0) {
    lVar13 = (long)segsize;
    local_88 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    u._0_8_ = lVar13;
    if (segsize < 0) {
      pcVar8 = 
      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
      ;
    }
    else {
      local_f0 = pdVar2 + lVar6;
      local_d8 = (long)lda;
      local_c8 = (TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
                  *)&local_f0;
      local_e8 = lVar13;
      local_e0 = lVar13;
      local_c0 = local_88;
      local_b8 = lVar13;
      local_a8 = local_d8;
      TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>::
      solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                (local_c8,(MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)&local_88);
      iVar1 = *luptr;
      *luptr = (int)(iVar1 + lVar13);
      local_98 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      uVar11 = (ulong)nrow;
      if ((nrow | segsize) < 0 && local_98 != (double *)0x0) goto LAB_00157efd;
      local_98 = local_98 + iVar1 + lVar13;
      local_a0 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      pdVar2 = local_a0 + lVar13;
      uVar10 = 2;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar10 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
      }
      if (nrow < -2) goto LAB_00157f1c;
      u._16_8_ = lVar13;
      if (-1 < nrow) {
        uVar12 = (ulong)((uint)(((ulong)local_98 & 7) == 0) &
                        (uint)((ulong)local_98 >> 3) & 0x1fffffff);
        pdVar2 = pdVar2 + uVar10 + uVar12;
        uVar7 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
        if ((long)uVar11 <= (long)uVar7) {
          uVar7 = uVar11;
        }
        if (((ulong)pdVar2 & 7) != 0) {
          uVar7 = uVar11;
        }
        lVar6 = uVar11 - uVar7;
        local_90 = lVar6 - (lVar6 >> 0x3f);
        uVar9 = local_90 & 0xfffffffffffffffe;
        if (0 < (long)uVar7) {
          memset(pdVar2,0,uVar7 * 8);
        }
        pdVar4 = local_a0;
        lVar13 = uVar9 + uVar7;
        if (1 < lVar6) {
          lVar6 = uVar7 + 2;
          if ((long)(uVar7 + 2) < lVar13) {
            lVar6 = lVar13;
          }
          memset(local_a0 + uVar12 + uVar10 + u._16_8_ + uVar7,0,
                 (~uVar7 + lVar6 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (uVar11 - lVar13 != 0 && lVar13 <= (long)uVar11) {
          memset(pdVar2 + ((long)local_90 >> 1) * 2 + uVar7,0,(uVar11 - lVar13) * 8);
        }
        uVar5 = u._16_8_;
        sparselu_gemm<double,long>
                  (uVar11,1,u._16_8_,local_98,local_a8,local_88,u._0_8_,pdVar2,
                   (long)(int)((nrow - (nrow + 1 >> 0x1f)) + 1U & 0xfffffffe));
        if (segsize != 0) {
          pdVar2 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data;
          uVar11 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_rows;
          uVar7 = 0;
          if ((long)uVar11 < 1) {
            uVar11 = uVar7;
          }
          uVar9 = 1;
          if (1 < segsize) {
            uVar9 = (ulong)(uint)segsize;
          }
          lVar6 = *(long *)&dense->
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ;
          piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          do {
            if ((iVar14 < 0) ||
               ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)(lVar15 + uVar7))) goto LAB_00157eb0;
            if (uVar11 == uVar7) goto LAB_00157ec7;
            lVar13 = (long)piVar3[lVar15 + uVar7];
            if ((lVar13 < 0) ||
               (*(long *)&(dense->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          ).field_0x8 <= lVar13)) goto LAB_00157e99;
            *(double *)(lVar6 + lVar13 * 8) = pdVar2[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          iVar14 = iVar14 + (int)uVar7;
        }
        if (nrow != 0) {
          lVar15 = *(long *)&dense->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ;
          uVar11 = 1;
          if (1 < nrow) {
            uVar11 = (ulong)(uint)nrow;
          }
          piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar7 = 0;
          do {
            if ((iVar14 < 0) ||
               ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)((long)iVar14 + uVar7))) goto LAB_00157eb0;
            if ((uint)nrow == uVar7) {
              pcVar8 = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, Level = 1]"
              ;
              goto LAB_00157ef3;
            }
            lVar6 = (long)piVar3[(long)iVar14 + uVar7];
            if ((lVar6 < 0) ||
               (*(long *)&(dense->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          ).field_0x8 <= lVar6)) goto LAB_00157e99;
            *(double *)(lVar15 + lVar6 * 8) =
                 *(double *)(lVar15 + lVar6 * 8) - pdVar4[uVar5 + uVar10 + uVar12 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
        return;
      }
      pcVar8 = 
      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, Level = 0]"
      ;
    }
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x8a,pcVar8);
  }
LAB_00157efd:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                ,0x94,
                "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
               );
LAB_00157ec7:
  pcVar8 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
  ;
  goto LAB_00157ef3;
LAB_00157eb0:
  pcVar8 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
  goto LAB_00157ef3;
LAB_00157e99:
  pcVar8 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
  ;
LAB_00157ef3:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,pcVar8);
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<SegSizeAtCompileTime>::run(const int segsize, BlockScalarVector& dense, ScalarVector& tempv, ScalarVector& lusup, Index& luptr, const Index lda,
                                                                  const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  // First, copy U[*,j] segment from dense(*) to tempv(*)
  // The result of triangular solve is in tempv[*]; 
    // The result of matric-vector update is in dense[*]
  Index isub = lptr + no_zeros; 
  int i;
  Index irow;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub); 
    tempv(i) = dense(irow); 
    ++isub; 
  }
  // Dense triangular solve -- start effective triangle
  luptr += lda * no_zeros + no_zeros; 
  // Form Eigen matrix and vector 
  Map<Matrix<Scalar,SegSizeAtCompileTime,SegSizeAtCompileTime>, 0, OuterStride<> > A( &(lusup.data()[luptr]), segsize, segsize, OuterStride<>(lda) );
  Map<Matrix<Scalar,SegSizeAtCompileTime,1> > u(tempv.data(), segsize);
  
  u = A.template triangularView<UnitLower>().solve(u); 
  
  // Dense matrix-vector product y <-- B*x 
  luptr += segsize;
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  Index ldl = internal::first_multiple(nrow, PacketSize);
  Map<Matrix<Scalar,Dynamic,SegSizeAtCompileTime>, 0, OuterStride<> > B( &(lusup.data()[luptr]), nrow, segsize, OuterStride<>(lda) );
  Index aligned_offset = internal::first_aligned(tempv.data()+segsize, PacketSize);
  Index aligned_with_B_offset = (PacketSize-internal::first_aligned(B.data(), PacketSize))%PacketSize;
  Map<Matrix<Scalar,Dynamic,1>, 0, OuterStride<> > l(tempv.data()+segsize+aligned_offset+aligned_with_B_offset, nrow, OuterStride<>(ldl) );
  
  l.setZero();
  internal::sparselu_gemm<Scalar>(l.rows(), l.cols(), B.cols(), B.data(), B.outerStride(), u.data(), u.outerStride(), l.data(), l.outerStride());
  
  // Scatter tempv[] into SPA dense[] as a temporary storage 
  isub = lptr + no_zeros;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub++); 
    dense(irow) = tempv(i);
  }
  
  // Scatter l into SPA dense[]
  for (i = 0; i < nrow; i++)
  {
    irow = lsub(isub++); 
    dense(irow) -= l(i);
  } 
}